

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  
  use_hdmp();
  fprintf(_stderr,
          "heap debugger enabled: use hdmp <executable> <core> to examine post-mortem output\n");
  iVar1 = fprintf(_stderr,
                  "debug level=%d, stack frames=%d, freelist size=%d, fill memory? %d, keep %d larger than %jd, buffer memory used=%d\n"
                  ,(ulong)(uint)hdbg.level,hdbg.maxframes & 0xffffffff,(ulong)(uint)hdbg.freelistmax
                  ,(ulong)(uint)hdbg.doFill,(int)hdbg.maxbig,hdbg.rememberbigger,malloc_total);
  return iVar1;
}

Assistant:

__attribute__((constructor)) static void init() {
    use_hdmp(); // just in case it hasn't been called yet
    fprintf(stderr, "heap debugger enabled: "
            "use hdmp <executable> <core> to examine post-mortem output\n");
    fprintf(stderr, "debug level=%d, stack frames=%d, freelist size=%d, "
                    "fill memory? %d, keep %d larger than %jd, "
                    "buffer memory used=%d\n",
        hdbg.level,
        (int)hdbg.maxframes,
        hdbg.freelistmax,
        hdbg.doFill,
        (int)hdbg.maxbig,
        (intmax_t)hdbg.rememberbigger,
        malloc_total);
}